

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar1;
  entry_type eVar2;
  reference piVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference pvVar7;
  int *in_RSI;
  long in_RDI;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *this_00;
  int32_t i;
  int32_t j;
  int ngram;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int32_t j_1;
  const_iterator it;
  vector<int,_std::allocator<int>_> ngrams;
  vector<int,_std::allocator<int>_> words;
  entry *in_stack_fffffffffffffe68;
  Dictionary *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int32_t in_stack_fffffffffffffe8c;
  const_iterator in_stack_fffffffffffffe90;
  const_iterator in_stack_fffffffffffffe98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  const_iterator in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  int local_dc;
  int local_d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  vector<int,_std::allocator<int>_> *local_80;
  int local_74;
  int *local_70;
  int *local_68;
  int *local_50;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  vector<int,_std::allocator<int>_> local_40;
  vector<int,_std::allocator<int>_> local_28;
  int *local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19bf94);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19bfa1);
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::cbegin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
  while( true ) {
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::cend
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe70,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe68);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_48);
    if (*piVar3 < *(int *)(in_RDI + 0x5c)) {
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_48);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_current,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    else {
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_48);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_current,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48);
  }
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
  local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
  _Var8._M_current._4_4_ = in_stack_fffffffffffffe7c;
  _Var8._M_current._0_4_ = in_stack_fffffffffffffe78;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_stack_fffffffffffffe80,_Var8);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_40);
  if (sVar4 != 0) {
    local_74 = 0;
    local_80 = &local_40;
    local_88._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffe70,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffe68);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_88);
      in_stack_fffffffffffffed4 = local_74;
      pmVar5 = std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_fffffffffffffe70,(key_type *)in_stack_fffffffffffffe68);
      *pmVar5 = in_stack_fffffffffffffed4;
      local_74 = local_74 + 1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_88);
    }
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffe70,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffe68);
    _Var8._M_current = (int *)&local_40;
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffec8,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_10,_Var8);
  }
  sVar6 = std::
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::size((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)0x19c289);
  *(size_type *)(in_RDI + 0x70) = sVar6;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
  __last._M_current._4_4_ = in_stack_fffffffffffffe7c;
  __last._M_current._0_4_ = in_stack_fffffffffffffe78;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffe80,__last,(int *)in_stack_fffffffffffffe70);
  local_d8 = 0;
  local_dc = 0;
  do {
    sVar4 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::size
                      ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28))
    ;
    if (sVar4 <= (ulong)(long)local_dc) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_28);
      *(int *)(in_RDI + 0x5c) = (int)sVar4;
      *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x5c) + *(int *)(in_RDI + 0x60);
      this_00 = (vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin(this_00);
      __gnu_cxx::
      __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
      ::operator+((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                  (difference_type)in_stack_fffffffffffffe70);
      __gnu_cxx::
      __normal_iterator<fasttext::entry_const*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>
      ::__normal_iterator<fasttext::entry*>
                ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                  *)in_stack_fffffffffffffe70,
                 (__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                  *)this_00);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end(this_00);
      __gnu_cxx::
      __normal_iterator<fasttext::entry_const*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>
      ::__normal_iterator<fasttext::entry*>
                ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                  *)in_stack_fffffffffffffe70,
                 (__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                  *)this_00);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::erase
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      initNgrams((Dictionary *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_current);
      return;
    }
    eVar2 = getType(in_stack_fffffffffffffe70,(int32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    if (eVar2 == label) {
LAB_0019c393:
      in_stack_fffffffffffffe90._M_current = (entry *)(in_RDI + 0x28);
      in_stack_fffffffffffffe98._M_current =
           std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                     ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                      in_stack_fffffffffffffe90._M_current,(long)local_dc);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                 in_stack_fffffffffffffe90._M_current,(long)local_d8);
      entry::operator=((entry *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe80._M_current = (int *)(in_RDI + 0x10);
      in_stack_fffffffffffffe7c = local_d8;
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28),
                 (long)local_d8);
      in_stack_fffffffffffffe8c =
           find((Dictionary *)in_stack_fffffffffffffe80._M_current,
                (string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_current,
                          (long)in_stack_fffffffffffffe8c);
      *pvVar7 = in_stack_fffffffffffffe7c;
      local_d8 = local_d8 + 1;
    }
    else {
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_28);
      if ((ulong)(long)local_d8 < sVar4) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_d8);
        if (*pvVar7 == local_dc) goto LAB_0019c393;
      }
    }
    local_dc = local_dc + 1;
  } while( true );
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  for (auto it = idx.cbegin(); it != idx.cend(); ++it) {
    if (*it < nwords_) {
      words.push_back(*it);
    } else {
      ngrams.push_back(*it);
    }
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label ||
        (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ + nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}